

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O2

int ON_Intersect(ON_Plane *plane,ON_Sphere *sphere,ON_Circle *circle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double x;
  ON_3dPoint p;
  bool bVar4;
  long lVar5;
  int iVar6;
  ON_Circle *pOVar7;
  byte bVar8;
  ON_3dPoint circle_center;
  ON_3dPoint C1;
  ON_3dPoint sphere_center;
  ON_3dVector R;
  ON_3dVector local_48;
  
  bVar8 = 0;
  dVar1 = sphere->radius;
  x = ABS(dVar1);
  ON_Sphere::Center(sphere);
  p.y = sphere_center.y;
  p.x = sphere_center.x;
  p.z = sphere_center.z;
  ON_Plane::ClosestPointTo(&circle_center,plane,p);
  dVar2 = ON_3dPoint::DistanceTo(&circle_center,&sphere_center);
  circle->radius = 0.0;
  bVar4 = ON_IsValid(x);
  iVar6 = 0;
  if ((bVar4) && (bVar4 = ON_IsValid(dVar2), bVar4)) {
    dVar3 = x * 1.490116119385e-08;
    if (dVar3 <= 2.3283064365386963e-10) {
      dVar3 = 2.3283064365386963e-10;
    }
    iVar6 = 0;
    if (dVar2 <= dVar3 + x) {
      if ((dVar1 != 0.0) && (dVar1 = 1.0 - (dVar2 / x) * (dVar2 / x), 8.881784197001252e-16 < dVar1)
         ) {
        if (dVar1 < 0.0) {
          dVar1 = sqrt(dVar1);
        }
        else {
          dVar1 = SQRT(dVar1);
        }
        circle->radius = dVar1 * x;
        if (2.3283064365386963e-10 < dVar1 * x) {
          iVar6 = 2;
          goto LAB_004d4c00;
        }
      }
      circle->radius = 0.0;
      ON_3dPoint::operator-(&R,&circle_center,&sphere_center);
      dVar1 = ON_3dVector::Length(&R);
      if (0.0 < dVar1) {
        ON_3dVector::Unitize(&R);
        operator*(&local_48,x,&R);
        ON_3dPoint::operator+(&C1,&sphere_center,&local_48);
        dVar2 = ON_3dPoint::DistanceTo(&C1,&sphere_center);
        if (ABS(sphere->radius - dVar2) < ABS(sphere->radius - dVar1)) {
          circle_center.z = C1.z;
          circle_center.x = C1.x;
          circle_center.y = C1.y;
        }
      }
      iVar6 = 1;
    }
  }
LAB_004d4c00:
  pOVar7 = circle;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pOVar7->plane).origin.x = (plane->origin).x;
    plane = (ON_Plane *)((long)plane + (ulong)bVar8 * -0x10 + 8);
    pOVar7 = (ON_Circle *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  (circle->plane).origin.z = circle_center.z;
  (circle->plane).origin.x = circle_center.x;
  (circle->plane).origin.y = circle_center.y;
  ON_Plane::UpdateEquation(&circle->plane);
  return iVar6;
}

Assistant:

int ON_Intersect(
        const ON_Plane& plane,
        const ON_Sphere& sphere, 
        ON_Circle& circle
        )
{
  // 16 April 2011 Dale Lear
  //   Prior to this date, this function did not return the correct answer.

  int rc = 0;
  const double sphere_radius = fabs(sphere.radius);
  double tol = sphere_radius*ON_SQRT_EPSILON;
  if ( !(tol >= ON_ZERO_TOLERANCE) )
    tol = ON_ZERO_TOLERANCE;
  const ON_3dPoint sphere_center = sphere.Center();
  ON_3dPoint circle_center = plane.ClosestPointTo(sphere_center);
  double d = circle_center.DistanceTo(sphere_center);

  circle.radius = 0.0;

  if ( ON_IsValid(sphere_radius) && ON_IsValid(d) && d <= sphere_radius + tol )
  {
    if ( sphere_radius > 0.0 )
    {
      d /= sphere_radius;
      d = 1.0 - d*d;
      // The d > 4.0*ON_EPSILON was picked by testing spheres with
      // radius = 1 and center = (0,0,0).  Do not make 4.0*ON_EPSILON 
      // any smaller and please discuss changes with Dale Lear.
      circle.radius = (d > 4.0*ON_EPSILON) ? sphere_radius*sqrt(d) : 0.0;
    }
    else
      circle.radius = 0.0;

    if ( circle.radius <= ON_ZERO_TOLERANCE )
    {
      // return a single point
      rc = 1;
      
      circle.radius = 0.0;

      //  When tolerance is in play, put the point on the sphere.
      //  If the caller prefers the plane, then they can adjust the
      //  returned answer to get the plane.
      ON_3dVector R = circle_center - sphere_center;
      double r0 = R.Length();
      if ( r0 > 0.0 )
      {
        R.Unitize();
        ON_3dPoint C1 = sphere_center + sphere_radius*R;
        double r1 = C1.DistanceTo(sphere_center);
        if ( fabs(sphere.radius-r1) < fabs(sphere.radius-r0) )
          circle_center = C1;
      }
    }
    else 
    {
      // return a circle
      rc = 2;
    }
  }

  // Update circle's plane here in case the input plane 
  // is the circle's plane member.
  circle.plane = plane;
  circle.plane.origin = circle_center;
  circle.plane.UpdateEquation();

  return rc;
}